

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o2.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::SegmentO2::Jacobian(MatrixXd *__return_storage_ptr__,SegmentO2 *this,MatrixXd *local)

{
  undefined1 auVar1 [16];
  runtime_error *this_00;
  undefined8 *puVar2;
  double *pdVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  double dVar7;
  long lVar8;
  long lVar9;
  ActualDstType actualDst;
  stringstream ss;
  undefined1 local_278 [16];
  Matrix<double,__1,__1,_0,__1,__1> local_268;
  RhsNested local_248;
  Lhs local_240;
  undefined1 local_238 [32];
  RhsNested local_218;
  RhsNested local_208;
  undefined1 local_200 [48];
  Rhs local_1d0;
  undefined1 local_1b8 [24];
  scalar_constant_op<double> local_1a0;
  RhsNested local_198;
  MatrixTypeNested local_178;
  variable_if_dynamic<long,__1> local_168;
  
  local_238._0_8_ = (pointer)0x0;
  local_1d0.m_matrix = (MatrixTypeNested)local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_278,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)local_238);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_1b8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_278,(Rhs *)&local_1d0,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_238);
  lVar4 = ((local_198.m_expression)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar4) {
    pdVar3 = ((local_198.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar9 = ((local_198.m_expression)->
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    bVar5 = false;
    lVar6 = 0;
    do {
      if (0 < lVar9) {
        lVar8 = 0;
        do {
          if (pdVar3[lVar8] < local_1a0.m_other) goto LAB_001aa12d;
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
      }
      lVar6 = lVar6 + 1;
      pdVar3 = pdVar3 + lVar9;
      bVar5 = lVar4 <= lVar6;
    } while (lVar6 != lVar4);
LAB_001aa12d:
    if (!bVar5) goto LAB_001aa31b;
  }
  local_200._0_8_ = &DAT_3ff0000000000000;
  local_240.m_expression = local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_238,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)local_200);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                   *)local_278,&local_240,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_238,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_200);
  if (0 < (long)local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data) {
    lVar4 = *(long *)local_278._0_8_;
    bVar5 = false;
    dVar7 = 0.0;
    do {
      if (0 < (long)local_278._8_8_) {
        lVar9 = 0;
        do {
          if ((double)local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows < *(double *)(lVar4 + lVar9 * 8)) goto LAB_001aa1d5;
          lVar9 = lVar9 + 1;
        } while (local_278._8_8_ != lVar9);
      }
      dVar7 = (double)((long)dVar7 + 1);
      lVar4 = lVar4 + *(Index *)(local_278._0_8_ + 8) * 8;
      bVar5 = (long)local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data <= (long)dVar7;
    } while ((double *)dVar7 !=
             local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
LAB_001aa1d5:
    if (!bVar5) {
LAB_001aa31b:
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),
                 "local coordinates out of bounds for reference element",0x35);
      local_278._0_8_ = &local_268;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"(0. <= local.array()).all() && (local.array() <= 1.).all()",""
                );
      local_238._0_8_ = local_238 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_278,(string *)local_238,0x29,(string *)local_200);
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
      }
      if ((Matrix<double,__1,__1,_0,__1,__1> *)local_278._0_8_ != &local_268) {
        operator_delete((void *)local_278._0_8_,
                        (long)local_268.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data + 1);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_278._0_8_ = &DAT_4000000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_1b8,
                   (this->alpha_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows,1,(scalar_constant_op<double> *)local_278);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)local_200,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)local_1b8,&this->alpha_,(scalar_product_op<double,_double> *)local_238);
  Eigen::
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
  ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
             *)local_238,
            (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             *)local_200,local);
  local_278._8_8_ = local_238._8_8_;
  local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_238._24_8_;
  local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)local_218;
  local_248 = local_208;
  local_1d0.m_matrix = &this->beta_;
  local_1d0.m_colFactor.m_value =
       (local_208->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
       m_cols;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
                   *)local_1b8,(Lhs *)local_278,&local_1d0,
                  (scalar_sum_op<double,_double> *)&local_240);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  lVar4 = (local_178->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if ((local_168.m_value != 0 && lVar4 != 0) &&
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar1 / SEXT816(local_168.m_value),0) < lVar4)) {
    puVar2 = (undefined8 *)
             __cxa_allocate_exception(8,lVar4,SUB168(auVar1 % SEXT816(local_168.m_value),0));
    *puVar2 = &std::out_of_range::vtable;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,lVar4,
             local_168.m_value);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Replicate<Eigen::Matrix<double,_1,1,0,_1,1>,1,_1>const>,Eigen::internal::assign_op<double,double>>
            (__return_storage_ptr__,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
              *)local_1b8,(assign_op<double,_double> *)&local_1d0);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd SegmentO2::Jacobian(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  return (2. * alpha_ * local).colwise() + beta_;
}